

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O1

bool embree::sse2::InstanceArrayIntersector1::pointQuery
               (PointQuery *query,PointQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  ulong *puVar4;
  float (*pafVar5) [16];
  undefined8 *puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  char cVar10;
  int iVar11;
  Geometry *pGVar12;
  long *plVar13;
  long lVar14;
  RTCPointQueryContext *pRVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  bool bVar22;
  long lVar23;
  _func_int *p_Var24;
  float in_XMM0_Da;
  float fVar25;
  float in_XMM0_Db;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  vfloat4 a0_1;
  float in_XMM1_Da;
  float fVar26;
  float in_XMM1_Db;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar27;
  float fVar28;
  undefined8 in_XMM2_Qa;
  ulong in_XMM2_Qb;
  float in_XMM3_Da;
  float in_XMM3_Db;
  float in_XMM3_Dc;
  float in_XMM3_Dd;
  float fVar29;
  float fVar30;
  ulong in_XMM4_Qa;
  float in_XMM4_Dc;
  float fVar31;
  ulong in_XMM5_Qa;
  float in_XMM5_Dc;
  float fVar34;
  float fVar35;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_XMM7 [16];
  vfloat4 a0;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vfloat4 l02;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float in_XMM11_Da;
  float in_XMM11_Db;
  float fVar48;
  float in_XMM11_Dc;
  float in_XMM11_Dd;
  float in_XMM12_Da;
  float fVar49;
  float in_XMM12_Db;
  float in_XMM12_Dc;
  float in_XMM12_Dd;
  float in_XMM13_Da;
  float in_XMM13_Db;
  float in_XMM13_Dc;
  float fVar50;
  float in_XMM13_Dd;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float in_XMM15_Da;
  float fVar55;
  float in_XMM15_Db;
  float in_XMM15_Dc;
  float in_XMM15_Dd;
  undefined8 local_e8;
  float local_e0;
  float local_dc;
  float local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  _func_int *local_98;
  undefined8 local_90;
  PointQuery *local_88;
  int local_80;
  PointQueryFunction local_78;
  RTCPointQueryContext *local_70;
  float local_68;
  void *local_60;
  undefined8 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  a0.field_0._0_12_ = in_XMM7._0_12_;
  uVar19 = (ulong)prim->primID_;
  pGVar12 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var24 = *(_func_int **)&pGVar12->field_0x58;
  if (p_Var24 == (_func_int *)0x0) {
    uVar21 = (ulong)*(uint *)(*(long *)&pGVar12[1].time_range.upper +
                             (long)pGVar12[1].intersectionFilterN * uVar19);
    if (uVar21 == 0xffffffff) {
      p_Var24 = (_func_int *)0x0;
    }
    else {
      p_Var24 = pGVar12[1].super_RefCount._vptr_RefCount[uVar21];
    }
  }
  if (p_Var24 == (_func_int *)0x0) {
    uVar18 = 0;
  }
  else {
    cVar10 = (pGVar12->field_8).field_0x1;
    plVar13 = *(long **)&pGVar12[1].fnumTimeSegments;
    iVar11 = (int)plVar13[4];
    if (cVar10 == '\x01') {
      if (iVar11 < 0x9244) {
        if (iVar11 == 0x9134) {
          lVar14 = *plVar13;
          lVar23 = plVar13[2] * uVar19;
          in_XMM13_Db = *(float *)(lVar14 + 0x10 + lVar23);
          in_XMM13_Da = *(float *)(lVar14 + lVar23);
          in_XMM0_Da = *(float *)(lVar14 + 4 + lVar23);
          in_XMM3_Da = *(float *)(lVar14 + 8 + lVar23);
          in_XMM13_Dc = *(float *)(lVar14 + 0x20 + lVar23);
          in_XMM13_Dd = 0.0;
          in_XMM0_Db = *(float *)(lVar14 + 0x14 + lVar23);
          in_XMM0_Dc = *(float *)(lVar14 + 0x24 + lVar23);
          in_XMM0_Dd = 0.0;
          in_XMM3_Db = *(float *)(lVar14 + 0x18 + lVar23);
          in_XMM3_Dc = *(float *)(lVar14 + 0x28 + lVar23);
          in_XMM3_Dd = 0.0;
          in_XMM2_Qa = CONCAT44(*(undefined4 *)(lVar14 + 0x1c + lVar23),
                                *(undefined4 *)(lVar14 + 0xc + lVar23));
          in_XMM2_Qb = (ulong)*(uint *)(lVar14 + 0x2c + lVar23);
        }
        else if (iVar11 == 0x9234) {
          lVar14 = *plVar13;
          lVar23 = plVar13[2] * uVar19;
          uVar7 = *(undefined8 *)(lVar14 + 4 + lVar23);
          in_XMM13_Db = (float)uVar7;
          in_XMM13_Dc = (float)((ulong)uVar7 >> 0x20);
          in_XMM13_Da = *(float *)(lVar14 + lVar23);
          in_XMM13_Dd = 0.0;
          uVar7 = *(undefined8 *)(lVar14 + 0x10 + lVar23);
          in_XMM0_Da = *(float *)(lVar14 + 0xc + lVar23);
          in_XMM0_Db = (float)uVar7;
          in_XMM0_Dc = (float)((ulong)uVar7 >> 0x20);
          in_XMM0_Dd = 0.0;
          uVar7 = *(undefined8 *)(lVar14 + 0x1c + lVar23);
          in_XMM3_Da = *(float *)(lVar14 + 0x18 + lVar23);
          in_XMM3_Db = (float)uVar7;
          in_XMM3_Dc = (float)((ulong)uVar7 >> 0x20);
          in_XMM3_Dd = 0.0;
          uVar21 = *(ulong *)(lVar14 + 0x28 + lVar23);
          in_XMM2_Qb = uVar21 >> 0x20;
          in_XMM2_Qa = CONCAT44((int)uVar21,*(undefined4 *)(lVar14 + 0x24 + lVar23));
        }
      }
      else if (iVar11 == 0xb001) {
        lVar14 = *plVar13;
        lVar23 = plVar13[2] * uVar19;
        uVar7 = *(undefined8 *)(lVar14 + 0x10 + lVar23);
        in_XMM3_Da = (float)uVar7;
        in_XMM3_Db = (float)((ulong)uVar7 >> 0x20);
        uVar7 = *(undefined8 *)(lVar14 + 0x34 + lVar23);
        in_XMM13_Da = *(float *)(lVar14 + lVar23);
        in_XMM0_Db = *(float *)(lVar14 + 4 + lVar23);
        in_XMM3_Dc = *(float *)(lVar14 + 8 + lVar23);
        in_XMM0_Da = *(float *)(lVar14 + 0xc + lVar23);
        in_XMM13_Db = (float)uVar7;
        in_XMM13_Dc = (float)((ulong)uVar7 >> 0x20);
        uVar7 = *(undefined8 *)(lVar14 + 0x1c + lVar23);
        fVar25 = *(float *)(lVar14 + 0x24 + lVar23);
        fVar41 = *(float *)(lVar14 + 0x28 + lVar23);
        fVar44 = *(float *)(lVar14 + 0x2c + lVar23);
        fVar34 = *(float *)(lVar14 + 0x30 + lVar23);
        fVar53 = fVar34 * fVar34 + fVar44 * fVar44 + fVar25 * fVar25 + fVar41 * fVar41;
        auVar37 = rsqrtss(ZEXT416((uint)fVar53),ZEXT416((uint)fVar53));
        fVar35 = auVar37._0_4_;
        fVar35 = fVar35 * fVar35 * fVar53 * -0.5 * fVar35 + fVar35 * 1.5;
        in_XMM13_Dd = fVar41 * fVar35;
        in_XMM0_Dd = fVar44 * fVar35;
        in_XMM3_Dd = fVar35 * fVar34;
        in_XMM0_Dc = *(float *)(lVar14 + 0x3c + lVar23);
        in_XMM2_Qa = CONCAT44((int)uVar7,*(undefined4 *)(lVar14 + 0x18 + lVar23));
        in_XMM2_Qb = CONCAT44(fVar25 * fVar35,(int)((ulong)uVar7 >> 0x20));
      }
      else if (iVar11 == 0x9244) {
        lVar14 = *plVar13;
        lVar23 = plVar13[2] * uVar19;
        pfVar1 = (float *)(lVar14 + lVar23);
        in_XMM13_Da = *pfVar1;
        in_XMM13_Db = pfVar1[1];
        in_XMM13_Dc = pfVar1[2];
        in_XMM13_Dd = pfVar1[3];
        pfVar1 = (float *)(lVar14 + 0x10 + lVar23);
        in_XMM0_Da = *pfVar1;
        in_XMM0_Db = pfVar1[1];
        in_XMM0_Dc = pfVar1[2];
        in_XMM0_Dd = pfVar1[3];
        pfVar1 = (float *)(lVar14 + 0x20 + lVar23);
        in_XMM3_Da = *pfVar1;
        in_XMM3_Db = pfVar1[1];
        in_XMM3_Dc = pfVar1[2];
        in_XMM3_Dd = pfVar1[3];
        puVar6 = (undefined8 *)(lVar14 + 0x30 + lVar23);
        in_XMM2_Qa = *puVar6;
        in_XMM2_Qb = puVar6[1];
      }
      fVar54 = (float)in_XMM2_Qa;
      fVar31 = (float)((ulong)in_XMM2_Qa >> 0x20);
      fVar28 = (float)in_XMM2_Qb;
      fVar25 = (float)(in_XMM2_Qb >> 0x20);
      fVar30 = in_XMM13_Dd * in_XMM0_Dd + in_XMM3_Dd * fVar25;
      fVar41 = in_XMM13_Dd * in_XMM0_Dd - in_XMM3_Dd * fVar25;
      fVar35 = fVar25 * fVar25 - in_XMM13_Dd * in_XMM13_Dd;
      fVar44 = fVar25 * fVar25 + in_XMM13_Dd * in_XMM13_Dd + -in_XMM0_Dd * in_XMM0_Dd +
               -in_XMM3_Dd * in_XMM3_Dd;
      fVar53 = in_XMM0_Dd * in_XMM0_Dd + fVar35 + -in_XMM3_Dd * in_XMM3_Dd;
      fVar26 = in_XMM13_Dd * in_XMM3_Dd - in_XMM0_Dd * fVar25;
      fVar34 = in_XMM0_Dd * fVar25 + in_XMM13_Dd * in_XMM3_Dd;
      fVar27 = in_XMM0_Dd * in_XMM3_Dd + in_XMM13_Dd * fVar25;
      fVar25 = in_XMM0_Dd * in_XMM3_Dd - in_XMM13_Dd * fVar25;
      fVar30 = fVar30 + fVar30;
      fVar26 = fVar26 + fVar26;
      fVar35 = in_XMM3_Dd * in_XMM3_Dd + fVar35 + -in_XMM0_Dd * in_XMM0_Dd;
      fVar29 = fVar44 * 1.0 + fVar30 * 0.0 + fVar26 * 0.0;
      fVar55 = fVar44 * 0.0 + fVar30 * 1.0 + fVar26 * 0.0;
      fVar43 = fVar44 * 0.0 + fVar30 * 0.0 + fVar26 * 1.0;
      fVar52 = fVar44 * 0.0 + fVar30 * 0.0 + fVar26 * 0.0;
      fVar27 = fVar27 + fVar27;
      fVar41 = fVar41 + fVar41;
      fVar30 = fVar41 * 1.0 + fVar53 * 0.0 + fVar27 * 0.0;
      fVar26 = fVar41 * 0.0 + fVar53 * 1.0 + fVar27 * 0.0;
      in_XMM5_Qa = CONCAT44(fVar26,fVar30);
      in_XMM5_Dc = fVar41 * 0.0 + fVar53 * 0.0 + fVar27 * 1.0;
      fVar27 = fVar41 * 0.0 + fVar53 * 0.0 + fVar27 * 0.0;
      fVar34 = fVar34 + fVar34;
      fVar25 = fVar25 + fVar25;
      fVar46 = fVar34 * 1.0 + fVar25 * 0.0 + fVar35 * 0.0;
      fVar49 = fVar34 * 0.0 + fVar25 * 1.0 + fVar35 * 0.0;
      fVar47 = fVar34 * 0.0 + fVar25 * 0.0 + fVar35 * 1.0;
      fVar48 = fVar34 * 0.0 + fVar25 * 0.0 + fVar35 * 0.0;
      fVar40 = in_XMM13_Db + 0.0;
      fVar42 = in_XMM13_Dc + 0.0;
      fVar45 = in_XMM0_Dc + 0.0;
      fVar41 = in_XMM3_Dc * fVar46;
      fVar44 = in_XMM3_Dc * fVar49;
      fVar34 = in_XMM3_Dc * fVar47;
      in_XMM3_Dd = in_XMM3_Dc * fVar48;
      a0.field_0._0_4_ = fVar46 * 0.0;
      a0.field_0._4_4_ = fVar49 * 0.0;
      a0.field_0._8_4_ = fVar47 * 0.0;
      fVar25 = fVar30 * 0.0 + a0.field_0._0_4_;
      fVar35 = fVar26 * 0.0 + a0.field_0._4_4_;
      in_XMM4_Qa = CONCAT44(fVar35,fVar25);
      in_XMM4_Dc = in_XMM5_Dc * 0.0 + a0.field_0._8_4_;
      fVar53 = in_XMM13_Da * fVar55;
      fVar50 = in_XMM13_Da * fVar43;
      fVar51 = in_XMM13_Da * fVar52;
      in_XMM13_Da = in_XMM13_Da * fVar29 + fVar25;
      in_XMM13_Db = fVar53 + fVar35;
      in_XMM13_Dc = fVar50 + in_XMM4_Dc;
      in_XMM13_Dd = fVar51 + fVar27 * 0.0 + fVar48 * 0.0;
      fVar35 = in_XMM0_Db * in_XMM5_Dc;
      fVar53 = in_XMM0_Db * fVar27;
      fVar25 = in_XMM0_Db * fVar30 + a0.field_0._0_4_;
      in_XMM0_Db = in_XMM0_Db * fVar26 + a0.field_0._4_4_;
      in_XMM0_Dc = fVar35 + a0.field_0._8_4_;
      in_XMM0_Dd = fVar53 + fVar48 * 0.0;
      in_XMM15_Da = in_XMM0_Da * fVar29 + fVar25;
      in_XMM15_Db = in_XMM0_Da * fVar55 + in_XMM0_Db;
      in_XMM15_Dc = in_XMM0_Da * fVar43 + in_XMM0_Dc;
      in_XMM15_Dd = in_XMM0_Da * fVar52 + in_XMM0_Dd;
      in_XMM12_Da = in_XMM3_Da * fVar29 + in_XMM3_Db * fVar30 + fVar41;
      in_XMM12_Db = in_XMM3_Da * fVar55 + in_XMM3_Db * fVar26 + fVar44;
      in_XMM12_Dc = in_XMM3_Da * fVar43 + in_XMM3_Db * in_XMM5_Dc + fVar34;
      in_XMM12_Dd = in_XMM3_Da * fVar52 + in_XMM3_Db * fVar27 + in_XMM3_Dd;
      in_XMM1_Da = fVar31 * fVar30 + fVar28 * fVar46;
      in_XMM1_Db = fVar31 * fVar26 + fVar28 * fVar49;
      in_XMM1_Dc = fVar31 * in_XMM5_Dc + fVar28 * fVar47;
      in_XMM1_Dd = fVar31 * fVar27 + fVar28 * fVar48;
      in_XMM11_Da = fVar54 * fVar29 + in_XMM1_Da + fVar40;
      in_XMM11_Db = fVar54 * fVar55 + in_XMM1_Db + fVar42;
      in_XMM11_Dc = fVar54 * fVar43 + in_XMM1_Dc + fVar45;
      in_XMM11_Dd = fVar54 * fVar52 + in_XMM1_Dd + 0.0;
    }
    else {
      fVar25 = in_XMM0_Da;
      fVar41 = in_XMM3_Da;
      fVar44 = in_XMM3_Db;
      fVar34 = in_XMM3_Dc;
      if (iVar11 < 0x9244) {
        if (iVar11 == 0x9134) {
          lVar14 = *plVar13;
          lVar23 = plVar13[2] * uVar19;
          in_XMM13_Db = *(float *)(lVar14 + 0x10 + lVar23);
          in_XMM13_Da = *(float *)(lVar14 + lVar23);
          in_XMM15_Da = *(float *)(lVar14 + 4 + lVar23);
          in_XMM12_Da = *(float *)(lVar14 + 8 + lVar23);
          in_XMM11_Da = *(float *)(lVar14 + 0xc + lVar23);
          in_XMM13_Dc = *(float *)(lVar14 + 0x20 + lVar23);
          in_XMM13_Dd = 0.0;
          in_XMM15_Db = *(float *)(lVar14 + 0x14 + lVar23);
          in_XMM12_Db = *(float *)(lVar14 + 0x18 + lVar23);
          in_XMM12_Dd = 0.0;
          fVar25 = *(float *)(lVar14 + 0x2c + lVar23);
          in_XMM0_Db = 0.0;
          in_XMM0_Dc = 0.0;
          in_XMM0_Dd = 0.0;
          in_XMM11_Dd = 0.0;
          in_XMM12_Dc = *(float *)(lVar14 + 0x28 + lVar23);
          in_XMM15_Dc = *(float *)(lVar14 + 0x24 + lVar23);
          in_XMM15_Dd = 0.0;
          in_XMM11_Db = *(float *)(lVar14 + 0x1c + lVar23);
          in_XMM11_Dc = fVar25;
        }
        else if (iVar11 == 0x9234) {
          lVar14 = *plVar13;
          lVar23 = plVar13[2] * uVar19;
          uVar7 = *(undefined8 *)(lVar14 + 4 + lVar23);
          in_XMM13_Db = (float)uVar7;
          in_XMM13_Dc = (float)((ulong)uVar7 >> 0x20);
          in_XMM13_Da = *(float *)(lVar14 + lVar23);
          in_XMM13_Dd = 0.0;
          uVar7 = *(undefined8 *)(lVar14 + 0x10 + lVar23);
          in_XMM15_Db = (float)uVar7;
          in_XMM15_Da = *(float *)(lVar14 + 0xc + lVar23);
          uVar8 = *(undefined8 *)(lVar14 + 0x1c + lVar23);
          in_XMM12_Db = (float)uVar8;
          in_XMM12_Da = *(float *)(lVar14 + 0x18 + lVar23);
          in_XMM12_Dd = 0.0;
          uVar9 = *(undefined8 *)(lVar14 + 0x28 + lVar23);
          fVar25 = (float)uVar9;
          in_XMM0_Db = (float)((ulong)uVar9 >> 0x20);
          in_XMM0_Dc = 0.0;
          in_XMM0_Dd = 0.0;
          in_XMM11_Da = *(float *)(lVar14 + 0x24 + lVar23);
          in_XMM11_Dd = 0.0;
          in_XMM12_Dc = (float)((ulong)uVar8 >> 0x20);
          in_XMM15_Dc = (float)((ulong)uVar7 >> 0x20);
          in_XMM15_Dd = 0.0;
          in_XMM11_Db = fVar25;
          in_XMM11_Dc = in_XMM0_Db;
        }
      }
      else if (iVar11 == 0xb001) {
        lVar14 = *plVar13;
        lVar23 = plVar13[2] * uVar19;
        uVar7 = *(undefined8 *)(lVar14 + 0x10 + lVar23);
        in_XMM12_Da = (float)uVar7;
        in_XMM12_Db = (float)((ulong)uVar7 >> 0x20);
        uVar7 = *(undefined8 *)(lVar14 + 0x34 + lVar23);
        in_XMM13_Db = (float)uVar7;
        in_XMM13_Dc = (float)((ulong)uVar7 >> 0x20);
        in_XMM13_Da = *(float *)(lVar14 + lVar23);
        in_XMM15_Db = *(float *)(lVar14 + 4 + lVar23);
        fVar41 = *(float *)(lVar14 + 8 + lVar23);
        fVar44 = 0.0;
        fVar34 = 0.0;
        in_XMM3_Dd = 0.0;
        in_XMM15_Da = *(float *)(lVar14 + 0xc + lVar23);
        in_XMM11_Da = *(float *)(lVar14 + 0x18 + lVar23);
        pfVar1 = (float *)(lVar14 + 0x1c + lVar23);
        in_XMM1_Da = *pfVar1;
        in_XMM1_Db = pfVar1[1];
        in_XMM1_Dc = 0.0;
        in_XMM1_Dd = 0.0;
        fVar25 = *(float *)(lVar14 + 0x24 + lVar23);
        fVar35 = *(float *)(lVar14 + 0x28 + lVar23);
        fVar53 = *(float *)(lVar14 + 0x2c + lVar23);
        in_XMM4_Dc = 0.0;
        fVar54 = *(float *)(lVar14 + 0x30 + lVar23);
        fVar28 = fVar54 * fVar54 + fVar53 * fVar53 + fVar25 * fVar25 + fVar35 * fVar35;
        auVar37 = rsqrtss(ZEXT416((uint)fVar28),ZEXT416((uint)fVar28));
        fVar31 = auVar37._0_4_;
        fVar31 = fVar31 * fVar31 * fVar28 * -0.5 * fVar31 + fVar31 * 1.5;
        in_XMM11_Dd = fVar25 * fVar31;
        in_XMM13_Dd = fVar35 * fVar31;
        in_XMM0_Db = fVar53 * fVar31;
        in_XMM4_Qa = (ulong)(uint)in_XMM0_Db;
        auVar37._0_4_ = fVar31 * fVar54;
        a0.field_0._8_4_ = fVar41;
        a0.field_0._0_8_ = auVar37._0_8_;
        in_XMM5_Qa = (ulong)(uint)in_XMM13_Dd;
        fVar25 = *(float *)(lVar14 + 0x3c + lVar23);
        in_XMM0_Dc = 0.0;
        in_XMM0_Dd = 0.0;
        in_XMM12_Dc = fVar41;
        in_XMM12_Dd = auVar37._0_4_;
        in_XMM15_Dc = fVar25;
        in_XMM15_Dd = in_XMM0_Db;
        in_XMM11_Db = in_XMM1_Da;
        in_XMM11_Dc = in_XMM1_Db;
        in_XMM5_Dc = in_XMM13_Dc;
      }
      else if (iVar11 == 0x9244) {
        lVar14 = *plVar13;
        lVar23 = plVar13[2] * uVar19;
        pfVar1 = (float *)(lVar14 + lVar23);
        in_XMM13_Da = *pfVar1;
        in_XMM13_Db = pfVar1[1];
        in_XMM13_Dc = pfVar1[2];
        in_XMM13_Dd = pfVar1[3];
        pfVar1 = (float *)(lVar14 + 0x10 + lVar23);
        in_XMM15_Da = *pfVar1;
        in_XMM15_Db = pfVar1[1];
        pfVar2 = (float *)(lVar14 + 0x20 + lVar23);
        in_XMM12_Da = *pfVar2;
        in_XMM12_Db = pfVar2[1];
        in_XMM12_Dd = pfVar2[3];
        pfVar3 = (float *)(lVar14 + 0x30 + lVar23);
        in_XMM11_Da = *pfVar3;
        in_XMM11_Dd = pfVar3[3];
        in_XMM12_Dc = pfVar2[2];
        in_XMM15_Dc = pfVar1[2];
        in_XMM15_Dd = pfVar1[3];
        in_XMM11_Db = pfVar3[1];
        in_XMM11_Dc = pfVar3[2];
      }
    }
    plVar13 = *(long **)&pGVar12[1].fnumTimeSegments;
    iVar11 = (int)plVar13[4];
    if (cVar10 == '\x01') {
      fVar53 = in_XMM13_Da;
      fVar54 = in_XMM13_Db;
      fVar35 = in_XMM13_Dc;
      fVar31 = in_XMM13_Dd;
      if (iVar11 < 0x9244) {
        if (iVar11 == 0x9134) {
          lVar14 = *plVar13;
          lVar23 = uVar19 * plVar13[2];
          in_XMM0_Db = *(float *)(lVar14 + 0x10 + lVar23);
          fVar25 = *(float *)(lVar14 + lVar23);
          in_XMM1_Da = *(float *)(lVar14 + 4 + lVar23);
          fVar41 = *(float *)(lVar14 + 0xc + lVar23);
          in_XMM0_Dc = *(float *)(lVar14 + 0x20 + lVar23);
          in_XMM0_Dd = 0.0;
          in_XMM1_Db = *(float *)(lVar14 + 0x14 + lVar23);
          in_XMM1_Dc = *(float *)(lVar14 + 0x24 + lVar23);
          in_XMM1_Dd = 0.0;
          fVar44 = *(float *)(lVar14 + 0x1c + lVar23);
          fVar34 = *(float *)(lVar14 + 0x2c + lVar23);
          in_XMM3_Dd = 0.0;
          fVar53 = *(float *)(lVar14 + 8 + lVar23);
          fVar54 = *(float *)(lVar14 + 0x18 + lVar23);
          fVar35 = *(float *)(lVar14 + 0x28 + lVar23);
          fVar31 = 0.0;
        }
        else if (iVar11 == 0x9234) {
          lVar14 = *plVar13;
          lVar23 = uVar19 * plVar13[2];
          uVar7 = *(undefined8 *)(lVar14 + 4 + lVar23);
          fVar25 = *(float *)(lVar14 + lVar23);
          in_XMM0_Db = (float)uVar7;
          in_XMM0_Dc = (float)((ulong)uVar7 >> 0x20);
          in_XMM0_Dd = 0.0;
          uVar7 = *(undefined8 *)(lVar14 + 0x10 + lVar23);
          in_XMM1_Da = *(float *)(lVar14 + 0xc + lVar23);
          in_XMM1_Db = (float)uVar7;
          in_XMM1_Dc = (float)((ulong)uVar7 >> 0x20);
          in_XMM1_Dd = 0.0;
          uVar7 = *(undefined8 *)(lVar14 + 0x1c + lVar23);
          uVar8 = *(undefined8 *)(lVar14 + 0x28 + lVar23);
          fVar41 = *(float *)(lVar14 + 0x24 + lVar23);
          fVar44 = (float)uVar8;
          fVar34 = (float)((ulong)uVar8 >> 0x20);
          in_XMM3_Dd = 0.0;
          fVar53 = *(float *)(lVar14 + 0x18 + lVar23);
          fVar54 = (float)uVar7;
          fVar35 = (float)((ulong)uVar7 >> 0x20);
          fVar31 = 0.0;
        }
      }
      else if (iVar11 == 0xb001) {
        lVar14 = *plVar13;
        lVar23 = uVar19 * plVar13[2];
        uVar7 = *(undefined8 *)(lVar14 + 0x10 + lVar23);
        fVar53 = (float)uVar7;
        fVar54 = (float)((ulong)uVar7 >> 0x20);
        uVar7 = *(undefined8 *)(lVar14 + 0x34 + lVar23);
        fVar25 = *(float *)(lVar14 + lVar23);
        in_XMM1_Db = *(float *)(lVar14 + 4 + lVar23);
        fVar35 = *(float *)(lVar14 + 8 + lVar23);
        in_XMM1_Da = *(float *)(lVar14 + 0xc + lVar23);
        in_XMM0_Db = (float)uVar7;
        in_XMM0_Dc = (float)((ulong)uVar7 >> 0x20);
        fVar41 = *(float *)(lVar14 + 0x18 + lVar23);
        uVar7 = *(undefined8 *)(lVar14 + 0x1c + lVar23);
        fVar44 = (float)uVar7;
        fVar34 = (float)((ulong)uVar7 >> 0x20);
        fVar28 = *(float *)(lVar14 + 0x24 + lVar23);
        fVar30 = *(float *)(lVar14 + 0x28 + lVar23);
        fVar26 = *(float *)(lVar14 + 0x2c + lVar23);
        fVar27 = *(float *)(lVar14 + 0x30 + lVar23);
        fVar29 = fVar27 * fVar27 + fVar26 * fVar26 + fVar28 * fVar28 + fVar30 * fVar30;
        auVar37 = rsqrtss(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
        fVar31 = auVar37._0_4_;
        fVar31 = fVar31 * fVar31 * fVar29 * -0.5 * fVar31 + fVar31 * 1.5;
        in_XMM3_Dd = fVar28 * fVar31;
        in_XMM0_Dd = fVar30 * fVar31;
        in_XMM1_Dd = fVar26 * fVar31;
        fVar31 = fVar31 * fVar27;
        in_XMM1_Dc = *(float *)(lVar14 + 0x3c + lVar23);
      }
      else if (iVar11 == 0x9244) {
        lVar14 = *plVar13;
        lVar23 = uVar19 * plVar13[2];
        pfVar1 = (float *)(lVar14 + lVar23);
        fVar25 = *pfVar1;
        in_XMM0_Db = pfVar1[1];
        in_XMM0_Dc = pfVar1[2];
        in_XMM0_Dd = pfVar1[3];
        pfVar1 = (float *)(lVar14 + 0x10 + lVar23);
        in_XMM1_Da = *pfVar1;
        in_XMM1_Db = pfVar1[1];
        in_XMM1_Dc = pfVar1[2];
        in_XMM1_Dd = pfVar1[3];
        pfVar1 = (float *)(lVar14 + 0x20 + lVar23);
        fVar53 = *pfVar1;
        fVar54 = pfVar1[1];
        fVar35 = pfVar1[2];
        fVar31 = pfVar1[3];
        pfVar1 = (float *)(lVar14 + 0x30 + lVar23);
        fVar41 = *pfVar1;
        fVar44 = pfVar1[1];
        fVar34 = pfVar1[2];
        in_XMM3_Dd = pfVar1[3];
      }
      fVar29 = in_XMM0_Dd * in_XMM1_Dd + fVar31 * in_XMM3_Dd;
      fVar26 = in_XMM0_Dd * in_XMM1_Dd - fVar31 * in_XMM3_Dd;
      fVar55 = in_XMM3_Dd * in_XMM3_Dd - in_XMM0_Dd * in_XMM0_Dd;
      fVar27 = in_XMM3_Dd * in_XMM3_Dd + in_XMM0_Dd * in_XMM0_Dd + -in_XMM1_Dd * in_XMM1_Dd +
               -fVar31 * fVar31;
      fVar49 = in_XMM1_Dd * in_XMM1_Dd + fVar55 + -fVar31 * fVar31;
      fVar52 = in_XMM0_Dd * fVar31 - in_XMM1_Dd * in_XMM3_Dd;
      fVar46 = in_XMM1_Dd * in_XMM3_Dd + in_XMM0_Dd * fVar31;
      fVar28 = in_XMM1_Dd * fVar31 + in_XMM0_Dd * in_XMM3_Dd;
      fVar30 = in_XMM1_Dd * fVar31 - in_XMM0_Dd * in_XMM3_Dd;
      fVar29 = fVar29 + fVar29;
      fVar52 = fVar52 + fVar52;
      fVar31 = fVar31 * fVar31 + fVar55 + -in_XMM1_Dd * in_XMM1_Dd;
      fVar55 = fVar27 * 1.0 + fVar29 * 0.0 + fVar52 * 0.0;
      fVar43 = fVar27 * 0.0 + fVar29 * 1.0 + fVar52 * 0.0;
      fVar52 = fVar27 * 0.0 + fVar29 * 0.0 + fVar52 * 1.0;
      fVar28 = fVar28 + fVar28;
      fVar26 = fVar26 + fVar26;
      fVar27 = fVar26 * 1.0 + fVar49 * 0.0 + fVar28 * 0.0;
      fVar29 = fVar26 * 0.0 + fVar49 * 1.0 + fVar28 * 0.0;
      fVar26 = fVar26 * 0.0 + fVar49 * 0.0 + fVar28 * 1.0;
      fVar46 = fVar46 + fVar46;
      fVar30 = fVar30 + fVar30;
      fVar49 = fVar46 * 1.0 + fVar30 * 0.0 + fVar31 * 0.0;
      fVar47 = fVar46 * 0.0 + fVar30 * 1.0 + fVar31 * 0.0;
      fVar30 = fVar46 * 0.0 + fVar30 * 0.0 + fVar31 * 1.0;
      fVar46 = in_XMM0_Db + 0.0;
      fVar48 = in_XMM0_Dc + 0.0;
      fVar31 = fVar25 * fVar43;
      fVar28 = fVar25 * fVar52;
      fVar25 = fVar25 * fVar55 + fVar27 * 0.0 + fVar49 * 0.0;
      in_XMM0_Db = fVar31 + fVar29 * 0.0 + fVar47 * 0.0;
      in_XMM0_Dc = fVar28 + fVar26 * 0.0 + fVar30 * 0.0;
      a0.field_0._0_4_ = in_XMM1_Da * fVar55 + in_XMM1_Db * fVar27 + fVar49 * 0.0;
      a0.field_0._4_4_ = in_XMM1_Da * fVar43 + in_XMM1_Db * fVar29 + fVar47 * 0.0;
      a0.field_0._8_4_ = in_XMM1_Da * fVar52 + in_XMM1_Db * fVar26 + fVar30 * 0.0;
      in_XMM5_Qa = CONCAT44(fVar53 * fVar43 + fVar54 * fVar29 + fVar35 * fVar47,
                            fVar53 * fVar55 + fVar54 * fVar27 + fVar35 * fVar49);
      in_XMM5_Dc = fVar53 * fVar52 + fVar54 * fVar26 + fVar35 * fVar30;
      in_XMM4_Qa = CONCAT44(fVar41 * fVar43 + fVar44 * fVar29 + fVar34 * fVar47 + fVar48,
                            fVar41 * fVar55 + fVar44 * fVar27 + fVar34 * fVar49 + fVar46);
      in_XMM4_Dc = fVar41 * fVar52 + fVar44 * fVar26 + fVar34 * fVar30 + in_XMM1_Dc + 0.0;
    }
    else if (iVar11 < 0x9244) {
      if (iVar11 == 0x9134) {
        lVar14 = *plVar13;
        lVar23 = uVar19 * plVar13[2];
        in_XMM0_Db = *(float *)(lVar14 + 0x10 + lVar23);
        fVar25 = *(float *)(lVar14 + lVar23);
        in_XMM0_Dc = *(float *)(lVar14 + 0x20 + lVar23);
        a0.field_0._4_4_ = (float)*(undefined4 *)(lVar14 + 0x14 + lVar23);
        a0.field_0._0_4_ = (float)*(undefined4 *)(lVar14 + 4 + lVar23);
        a0.field_0._8_4_ = (float)*(undefined4 *)(lVar14 + 0x24 + lVar23);
        in_XMM5_Qa = CONCAT44(*(undefined4 *)(lVar14 + 0x18 + lVar23),
                              *(undefined4 *)(lVar14 + 8 + lVar23));
        in_XMM5_Dc = *(float *)(lVar14 + 0x28 + lVar23);
        in_XMM4_Qa = CONCAT44(*(undefined4 *)(lVar14 + 0x1c + lVar23),
                              *(undefined4 *)(lVar14 + 0xc + lVar23));
        in_XMM4_Dc = *(float *)(lVar14 + 0x2c + lVar23);
      }
      else if (iVar11 == 0x9234) {
        lVar14 = *plVar13;
        lVar23 = uVar19 * plVar13[2];
        uVar7 = *(undefined8 *)(lVar14 + 4 + lVar23);
        fVar25 = *(float *)(lVar14 + lVar23);
        in_XMM0_Db = (float)uVar7;
        in_XMM0_Dc = (float)((ulong)uVar7 >> 0x20);
        uVar7 = *(undefined8 *)(lVar14 + 0x10 + lVar23);
        a0.field_0._4_4_ = (float)(int)uVar7;
        a0.field_0._0_4_ = (float)*(undefined4 *)(lVar14 + 0xc + lVar23);
        a0.field_0._8_4_ = (float)(int)((ulong)uVar7 >> 0x20);
        uVar7 = *(undefined8 *)(lVar14 + 0x1c + lVar23);
        in_XMM5_Qa = CONCAT44((int)uVar7,*(undefined4 *)(lVar14 + 0x18 + lVar23));
        in_XMM5_Dc = (float)((ulong)uVar7 >> 0x20);
        uVar7 = *(undefined8 *)(lVar14 + 0x28 + lVar23);
        in_XMM4_Dc = (float)((ulong)uVar7 >> 0x20);
        in_XMM4_Qa = CONCAT44((int)uVar7,*(undefined4 *)(lVar14 + 0x24 + lVar23));
      }
    }
    else if (iVar11 == 0xb001) {
      lVar14 = *plVar13;
      lVar23 = uVar19 * plVar13[2];
      in_XMM5_Qa = *(ulong *)(lVar14 + 0x10 + lVar23);
      uVar7 = *(undefined8 *)(lVar14 + 0x34 + lVar23);
      fVar25 = *(float *)(lVar14 + lVar23);
      in_XMM5_Dc = *(float *)(lVar14 + 8 + lVar23);
      auVar33._4_4_ = *(undefined4 *)(lVar14 + 4 + lVar23);
      auVar33._0_4_ = *(undefined4 *)(lVar14 + 0xc + lVar23);
      in_XMM0_Db = (float)uVar7;
      in_XMM0_Dc = (float)((ulong)uVar7 >> 0x20);
      uVar7 = *(undefined8 *)(lVar14 + 0x1c + lVar23);
      fVar41 = *(float *)(lVar14 + 0x24 + lVar23);
      fVar44 = *(float *)(lVar14 + 0x28 + lVar23);
      fVar34 = *(float *)(lVar14 + 0x2c + lVar23);
      fVar35 = *(float *)(lVar14 + 0x30 + lVar23);
      fVar44 = fVar35 * fVar35 + fVar34 * fVar34 + fVar41 * fVar41 + fVar44 * fVar44;
      auVar37 = rsqrtss(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44));
      fVar41 = auVar37._0_4_;
      auVar33._12_4_ = fVar34 * (fVar41 * fVar41 * fVar44 * -0.5 * fVar41 + fVar41 * 1.5);
      auVar33._8_4_ = *(undefined4 *)(lVar14 + 0x3c + lVar23);
      a0.field_0._0_12_ = auVar33._0_12_;
      in_XMM4_Qa = CONCAT44((int)uVar7,*(undefined4 *)(lVar14 + 0x18 + lVar23));
      in_XMM4_Dc = (float)((ulong)uVar7 >> 0x20);
    }
    else if (iVar11 == 0x9244) {
      lVar14 = *plVar13;
      lVar23 = uVar19 * plVar13[2];
      pfVar1 = (float *)(lVar14 + lVar23);
      fVar25 = *pfVar1;
      in_XMM0_Db = pfVar1[1];
      in_XMM0_Dc = pfVar1[2];
      a0.field_0._0_12_ = SUB1612(*(undefined1 (*) [16])(lVar14 + 0x10 + lVar23),0);
      puVar4 = (ulong *)(lVar14 + 0x20 + lVar23);
      in_XMM5_Qa = *puVar4;
      in_XMM5_Dc = (float)puVar4[1];
      puVar4 = (ulong *)(lVar14 + 0x30 + lVar23);
      in_XMM4_Qa = *puVar4;
      in_XMM4_Dc = (float)puVar4[1];
    }
    fVar41 = (float)in_XMM5_Qa;
    fVar44 = (float)(in_XMM5_Qa >> 0x20);
    fVar53 = a0.field_0._0_4_;
    fVar54 = a0.field_0._4_4_;
    fVar31 = a0.field_0._8_4_;
    auVar32._0_4_ = fVar53 * fVar44 - fVar41 * fVar54;
    fVar34 = fVar54 * in_XMM5_Dc - fVar44 * fVar31;
    fVar35 = fVar31 * fVar41 - in_XMM5_Dc * fVar53;
    auVar32._4_4_ = fVar41 * in_XMM0_Db - fVar44 * fVar25;
    auVar32._8_4_ = fVar54 * fVar25 - in_XMM0_Db * fVar53;
    auVar32._12_4_ = 0;
    auVar36._4_4_ = fVar44 * in_XMM0_Dc - in_XMM5_Dc * in_XMM0_Db;
    auVar36._0_4_ = fVar34;
    auVar36._8_4_ = fVar31 * in_XMM0_Db - in_XMM0_Dc * fVar54;
    auVar36._12_4_ = 0;
    auVar38._4_4_ = in_XMM5_Dc * fVar25 - fVar41 * in_XMM0_Dc;
    auVar38._0_4_ = fVar35;
    auVar38._8_4_ = fVar53 * in_XMM0_Dc - fVar25 * fVar31;
    auVar38._12_4_ = 0;
    fVar25 = in_XMM0_Dc * auVar32._0_4_ + in_XMM0_Db * fVar35 + fVar25 * fVar34;
    auVar39._4_4_ = fVar25;
    auVar39._0_4_ = fVar25;
    auVar39._8_4_ = fVar25;
    auVar39._12_4_ = fVar25;
    auVar37 = divps(auVar36,auVar39);
    auVar16._4_4_ = fVar25;
    auVar16._0_4_ = fVar25;
    auVar16._8_4_ = fVar25;
    auVar16._12_4_ = fVar25;
    auVar39 = divps(auVar38,auVar16);
    auVar17._4_4_ = fVar25;
    auVar17._0_4_ = fVar25;
    auVar17._8_4_ = fVar25;
    auVar17._12_4_ = fVar25;
    auVar33 = divps(auVar32,auVar17);
    fVar34 = (float)in_XMM4_Qa;
    fVar35 = (float)(in_XMM4_Qa >> 0x20);
    fVar31 = auVar33._0_4_;
    fVar28 = auVar33._4_4_;
    fVar30 = auVar33._8_4_;
    fVar55 = auVar39._0_4_;
    fVar43 = auVar39._4_4_;
    fVar52 = auVar39._8_4_;
    fVar26 = auVar37._0_4_;
    fVar27 = auVar37._4_4_;
    fVar29 = auVar37._8_4_;
    fVar25 = fVar34 * fVar26 + fVar35 * fVar55 + in_XMM4_Dc * fVar31;
    fVar41 = fVar34 * fVar27 + fVar35 * fVar43 + in_XMM4_Dc * fVar28;
    fVar44 = fVar34 * fVar29 + fVar35 * fVar52 + in_XMM4_Dc * fVar30;
    fVar46 = fVar34 * auVar37._12_4_ + fVar35 * auVar39._12_4_ + in_XMM4_Dc * auVar33._12_4_;
    fVar34 = -fVar25;
    fVar35 = -fVar41;
    fVar53 = -fVar44;
    fVar54 = -fVar46;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_68 = 0.0;
      if (((1e-05 < ABS(fVar29 * fVar52 + fVar27 * fVar43 + fVar26 * fVar55)) ||
          (1e-05 < ABS(fVar29 * fVar30 + fVar27 * fVar28 + fVar26 * fVar31))) ||
         (1e-05 < ABS(fVar52 * fVar30 + fVar43 * fVar28 + fVar55 * fVar31))) {
        bVar22 = false;
      }
      else {
        fVar26 = fVar29 * fVar29 + fVar27 * fVar27 + fVar26 * fVar26;
        fVar27 = fVar43 * fVar43 + fVar55 * fVar55 + fVar52 * fVar52;
        bVar22 = false;
        if (((ABS(fVar26 - fVar27) <= 1e-05) &&
            (fVar29 = fVar28 * fVar28 + fVar31 * fVar31 + fVar30 * fVar30, bVar22 = false,
            ABS(fVar26 - fVar29) <= 1e-05)) &&
           (fVar27 = ABS(fVar27 - fVar29), bVar22 = fVar27 <= 1e-05, fVar27 <= 1e-05)) {
          bVar22 = true;
          if (fVar26 < 0.0) {
            local_c8 = fVar34;
            fStack_c4 = fVar35;
            fStack_c0 = fVar53;
            fStack_bc = fVar54;
            local_b8 = fVar25;
            fStack_b4 = fVar41;
            fStack_b0 = fVar44;
            fStack_ac = fVar46;
            local_a8 = auVar37;
            local_68 = sqrtf(fVar26);
            auVar37 = local_a8;
            fVar25 = local_b8;
            fVar41 = fStack_b4;
            fVar44 = fStack_b0;
            fVar34 = local_c8;
            fVar35 = fStack_c4;
            fVar53 = fStack_c0;
            fVar54 = fStack_bc;
          }
          else {
            local_68 = SQRT(fVar26);
          }
        }
      }
      local_80 = 2 - (uint)bVar22;
    }
    else {
      local_80 = 2;
      local_68 = 0.0;
    }
    pRVar15 = context->userContext;
    uVar20 = pRVar15->instStackSize;
    *(ulong *)(pRVar15->instID + uVar20) = CONCAT44((*prim).primID_,(*prim).instID_);
    *(undefined1 (*) [16])pRVar15->world2inst[uVar20] = auVar37;
    *(undefined1 (*) [16])(pRVar15->world2inst[uVar20] + 4) = auVar39;
    *(undefined1 (*) [16])(pRVar15->world2inst[uVar20] + 8) = auVar33;
    pfVar1 = pRVar15->world2inst[uVar20] + 0xc;
    *pfVar1 = fVar34;
    pfVar1[1] = fVar35;
    pfVar1[2] = fVar53;
    pfVar1[3] = fVar54;
    pafVar5 = pRVar15->inst2world + uVar20;
    (*pafVar5)[0] = in_XMM13_Da;
    (*pafVar5)[1] = in_XMM13_Db;
    (*pafVar5)[2] = in_XMM13_Dc;
    (*pafVar5)[3] = in_XMM13_Dd;
    pfVar1 = pRVar15->inst2world[uVar20] + 4;
    *pfVar1 = in_XMM15_Da;
    pfVar1[1] = in_XMM15_Db;
    pfVar1[2] = in_XMM15_Dc;
    pfVar1[3] = in_XMM15_Dd;
    pfVar1 = pRVar15->inst2world[uVar20] + 8;
    *pfVar1 = in_XMM12_Da;
    pfVar1[1] = in_XMM12_Db;
    pfVar1[2] = in_XMM12_Dc;
    pfVar1[3] = in_XMM12_Dd;
    pfVar1 = pRVar15->inst2world[uVar20] + 0xc;
    *pfVar1 = in_XMM11_Da;
    pfVar1[1] = in_XMM11_Db;
    pfVar1[2] = in_XMM11_Dc;
    pfVar1[3] = in_XMM11_Dd;
    pRVar15->instStackSize = pRVar15->instStackSize + 1;
    local_dc = query->time;
    fVar34 = (query->p).field_0.field_0.x;
    fVar35 = (query->p).field_0.field_0.y;
    fVar53 = (query->p).field_0.field_0.z;
    local_e8 = CONCAT44(fVar34 * auVar37._4_4_ + fVar35 * fVar43 + (fVar53 * fVar28 - fVar41),
                        fVar34 * auVar37._0_4_ + fVar35 * fVar55 + (fVar53 * fVar31 - fVar25));
    local_e0 = fVar34 * auVar37._8_4_ + fVar35 * fVar52 + (fVar53 * fVar30 - fVar44);
    local_d8 = query->radius * local_68;
    local_88 = context->query_ws;
    local_78 = context->func;
    local_70 = context->userContext;
    local_60 = context->userPtr;
    local_90 = 0;
    local_58 = 0xffffffffffffffff;
    local_48 = local_88->radius;
    fVar25 = local_88->radius;
    local_98 = p_Var24;
    if (local_80 == 2) {
      fStack_44 = fVar25;
      fStack_40 = fVar25;
      fStack_3c = fVar25;
      if ((fVar25 < INFINITY) && (local_70->instStackSize != 0)) {
        fStack_44 = local_48;
        fStack_40 = local_48;
        fStack_3c = local_48;
        pointQuery();
        fVar25 = local_38;
        fStack_44 = fStack_34;
        fStack_40 = fStack_30;
        fStack_3c = fStack_2c;
      }
    }
    else {
      fVar25 = local_68 * fVar25;
      fStack_44 = fVar25;
      fStack_40 = fVar25;
      fStack_3c = fVar25;
    }
    local_48 = fVar25;
    uVar18 = (**(code **)(p_Var24 + 0x88))(p_Var24 + 0x58,&local_e8);
    pRVar15 = context->userContext;
    uVar20 = pRVar15->instStackSize - 1;
    pRVar15->instStackSize = uVar20;
    pRVar15->instID[uVar20] = 0xffffffff;
    pRVar15->instPrimID[pRVar15->instStackSize] = 0xffffffff;
  }
  return (bool)uVar18;
}

Assistant:

bool InstanceArrayIntersector1::pointQuery(PointQuery* query, PointQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      const AffineSpace3fa local2world = instance->getLocal2World(prim.primID_);
      const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_);
      float similarityScale = 0.f;
      const bool similtude = context->query_type == POINT_QUERY_TYPE_SPHERE
                           && similarityTransform(world2local, &similarityScale);
      assert((similtude && similarityScale > 0) || !similtude);

      if (likely(instance_id_stack::push(context->userContext, prim.instID_, prim.primID_, world2local, local2world)))
      {
        PointQuery query_inst;
        query_inst.time = query->time;
        query_inst.p = xfmPoint(world2local, query->p); 
        query_inst.radius = query->radius * similarityScale;

        PointQueryContext context_inst(
          (Scene*)object, 
          context->query_ws, 
          similtude ? POINT_QUERY_TYPE_SPHERE : POINT_QUERY_TYPE_AABB,
          context->func,
          context->userContext,
          similarityScale,
          context->userPtr);

        bool changed = object->intersectors.pointQuery(&query_inst, &context_inst);
        instance_id_stack::pop(context->userContext);
        return changed;
      }
      return false;
    }